

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O2

token * __thiscall argo::pointer::make_token(token *__return_storage_ptr__,pointer *this,string *s)

{
  istream *piVar1;
  size_t i;
  istringstream is;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)s,_S_in);
  piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)&is);
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    __return_storage_ptr__->m_type = array_e;
    (__return_storage_ptr__->m_name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_name).field_2;
    (__return_storage_ptr__->m_name)._M_string_length = 0;
    (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_index = i;
  }
  else {
    token::token(__return_storage_ptr__,s);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  return __return_storage_ptr__;
}

Assistant:

pointer::token pointer::make_token(const string &s)
{
    istringstream is(s);

    size_t i;

    if (is >> i)
    {
        return token(i);
    }
    else
    {
        return token(s);
    }
}